

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

FilterCoordinator * __thiscall
helics::FilterFederate::getFilterCoordinator(FilterFederate *this,InterfaceHandle handle)

{
  bool bVar1;
  pointer pFVar2;
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>,_bool>
  pVar3;
  FilterCoordinator *ffp;
  __single_object ff;
  iterator fnd;
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  InterfaceHandle *in_stack_ffffffffffffff98;
  _Self local_28;
  _Self local_20 [3];
  pointer local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x6591f8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    std::make_unique<helics::FilterCoordinator>();
    pFVar2 = std::
             unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
             ::get((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                    *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    pVar3 = std::
            map<helics::InterfaceHandle,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>>
            ::
            emplace<helics::InterfaceHandle&,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>
                      (in_RDI,in_stack_ffffffffffffff98,
                       (unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    local_8 = pFVar2;
    std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>::
    ~unique_ptr((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                 *)CONCAT17(pVar3.second,in_stack_ffffffffffffff90));
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
                  *)0x6592b8);
    local_8 = std::
              unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
              ::get((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                     *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  }
  return local_8;
}

Assistant:

FilterCoordinator* FilterFederate::getFilterCoordinator(InterfaceHandle handle)
{
    auto fnd = filterCoord.find(handle);
    if (fnd == filterCoord.end()) {
        // just make a dummy filterFunction so we have something to return
        auto ff = std::make_unique<FilterCoordinator>();
        auto* ffp = ff.get();
        filterCoord.emplace(handle, std::move(ff));
        return ffp;
    }
    return fnd->second.get();
}